

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrix.h
# Opt level: O0

void __thiscall
Eigen::internal::
gemm_functor<float,_long,_Eigen::internal::general_matrix_matrix_product<long,_float,_1,_false,_float,_0,_false,_0,_1>,_Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>,_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_Eigen::internal::gemm_blocking_space<0,_float,_float,_-1,_-1,_-1,_1,_false>_>
::operator()(gemm_functor<float,_long,_Eigen::internal::general_matrix_matrix_product<long,_float,_1,_false,_float,_0,_false,_0,_1>,_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::internal::gemm_blocking_space<0,_float,_float,__1,__1,__1,_1,_false>_>
             *this,long row,long rows,long col,long cols,GemmParallelInfo<long> *info)

{
  Index depth;
  Scalar *_lhs;
  Index lhsStride;
  Scalar *_rhs;
  Index rhsStride;
  Scalar *_res;
  Index resIncr;
  Index resStride;
  GemmParallelInfo<long> *info_local;
  long cols_local;
  long col_local;
  long rows_local;
  long row_local;
  gemm_functor<float,_long,_Eigen::internal::general_matrix_matrix_product<long,_float,_1,_false,_float,_0,_false,_0,_1>,_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::internal::gemm_blocking_space<0,_float,_float,__1,__1,__1,_1,_false>_>
  *this_local;
  
  info_local = (GemmParallelInfo<long> *)cols;
  if (cols == -1) {
    info_local = (GemmParallelInfo<long> *)
                 PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::cols
                           (&this->m_rhs->
                             super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>);
  }
  depth = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>_>::cols
                    (&this->m_lhs->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>_>);
  _lhs = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>_>::coeffRef
                   (&this->m_lhs->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>_>,
                    row,0);
  lhsStride = Matrix<float,_-1,_-1,_1,_-1,_-1>::outerStride(this->m_lhs);
  _rhs = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::coeffRef
                   (&this->m_rhs->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,0,
                    col);
  rhsStride = Matrix<float,_-1,_-1,_0,_-1,_-1>::outerStride(this->m_rhs);
  _res = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::coeffRef
                   (&this->m_dest->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,
                    row,col);
  resIncr = Matrix<float,_-1,_-1,_0,_-1,_-1>::innerStride(this->m_dest);
  resStride = Matrix<float,_-1,_-1,_0,_-1,_-1>::outerStride(this->m_dest);
  general_matrix_matrix_product<long,_float,_1,_false,_float,_0,_false,_0,_1>::run
            (rows,(long)info_local,depth,_lhs,lhsStride,_rhs,rhsStride,_res,resIncr,resStride,
             this->m_actualAlpha,&this->m_blocking->super_level3_blocking<float,_float>,info);
  return;
}

Assistant:

void operator() (Index row, Index rows, Index col=0, Index cols=-1, GemmParallelInfo<Index>* info=0) const
  {
    if(cols==-1)
      cols = m_rhs.cols();

    Gemm::run(rows, cols, m_lhs.cols(),
              &m_lhs.coeffRef(row,0), m_lhs.outerStride(),
              &m_rhs.coeffRef(0,col), m_rhs.outerStride(),
              (Scalar*)&(m_dest.coeffRef(row,col)), m_dest.innerStride(), m_dest.outerStride(),
              m_actualAlpha, m_blocking, info);
  }